

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterDropColumn(Parse *pParse,SrcList *pSrc,Token *pName)

{
  int iVar1;
  sqlite3 *db_00;
  i16 iVar2;
  int iVar3;
  uint uVar4;
  uint iDb_00;
  int addr_00;
  int p2;
  int p3;
  int iVar5;
  Table *pTab_00;
  Vdbe *p;
  char *pcVar6;
  int iColPos;
  int iPos;
  int regOut;
  Vdbe *v;
  int iCur;
  int nField;
  Index *pPk;
  int regRec;
  int reg;
  int addr;
  int i;
  int iCol;
  char *zCol;
  char *zDb;
  int iDb;
  Table *pTab;
  sqlite3 *db;
  Token *pName_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  _i = (char *)0x0;
  if ((((db_00->mallocFailed == '\0') &&
       (pTab_00 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTab_00 != (Table *)0x0)) &&
      (iVar3 = isAlterableTable(pParse,pTab_00), iVar3 == 0)) &&
     ((iVar3 = isRealTable(pParse,pTab_00,1), iVar3 == 0 &&
      (_i = sqlite3NameFromToken(db_00,pName), _i != (char *)0x0)))) {
    uVar4 = sqlite3ColumnIndex(pTab_00,_i);
    if ((int)uVar4 < 0) {
      sqlite3ErrorMsg(pParse,"no such column: \"%T\"",pName);
    }
    else if ((pTab_00->aCol[(int)uVar4].colFlags & 9) == 0) {
      if (pTab_00->nCol < 2) {
        sqlite3ErrorMsg(pParse,"cannot drop column \"%s\": no other columns exist",_i);
      }
      else {
        iDb_00 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
        pcVar6 = db_00->aDb[(int)iDb_00].zDbSName;
        iVar3 = sqlite3AuthCheck(pParse,0x1a,pcVar6,pTab_00->zName,_i);
        if (iVar3 == 0) {
          renameTestSchema(pParse,pcVar6,(uint)(iDb_00 == 1),"",0);
          renameFixQuotes(pParse,pcVar6,(uint)(iDb_00 == 1));
          sqlite3NestedParse(pParse,
                             "UPDATE \"%w\".sqlite_master SET sql = sqlite_drop_column(%d, sql, %d) WHERE (type==\'table\' AND tbl_name=%Q COLLATE nocase)"
                             ,pcVar6,(ulong)iDb_00,(ulong)uVar4,pTab_00->zName);
          renameReloadSchema(pParse,iDb_00,2);
          renameTestSchema(pParse,pcVar6,(uint)(iDb_00 == 1),"after drop column",1);
          if ((pParse->nErr == 0) && ((pTab_00->aCol[(int)uVar4].colFlags & 0x20) == 0)) {
            _iCur = (Index *)0x0;
            v._4_4_ = 0;
            p = sqlite3GetVdbe(pParse);
            iVar3 = pParse->nTab;
            pParse->nTab = iVar3 + 1;
            sqlite3OpenTable(pParse,iVar3,iDb_00,pTab_00,0x71);
            addr_00 = sqlite3VdbeAddOp1(p,0x24,iVar3);
            iVar1 = pParse->nMem;
            p2 = iVar1 + 1;
            pParse->nMem = p2;
            if ((pTab_00->tabFlags & 0x80) == 0) {
              sqlite3VdbeAddOp2(p,0x87,iVar3,p2);
              pParse->nMem = (int)pTab_00->nCol + pParse->nMem;
            }
            else {
              _iCur = sqlite3PrimaryKeyIndex(pTab_00);
              pParse->nMem = (uint)_iCur->nColumn + pParse->nMem;
              for (reg = 0; reg < (int)(uint)_iCur->nKeyCol; reg = reg + 1) {
                sqlite3VdbeAddOp3(p,0x5e,iVar3,reg,p2 + reg + 1);
              }
              v._4_4_ = (uint)_iCur->nKeyCol;
            }
            p3 = pParse->nMem + 1;
            pParse->nMem = p3;
            for (reg = 0; reg < pTab_00->nCol; reg = reg + 1) {
              if ((reg != uVar4) && ((pTab_00->aCol[reg].colFlags & 0x20) == 0)) {
                if (_iCur == (Index *)0x0) {
                  iColPos = iVar1 + 2 + v._4_4_;
                }
                else {
                  iVar2 = sqlite3TableColumnToIndex(_iCur,(i16)reg);
                  iVar5 = (int)iVar2;
                  iVar2 = sqlite3TableColumnToIndex(_iCur,(i16)uVar4);
                  if (iVar5 < (int)(uint)_iCur->nKeyCol) goto LAB_00225c48;
                  iColPos = (iVar1 + 2 + iVar5) - (uint)(iVar2 < iVar5);
                }
                if (reg == pTab_00->iPKey) {
                  sqlite3VdbeAddOp2(p,0x4b,0,iColPos);
                }
                else {
                  sqlite3ExprCodeGetColumnOfTable(p,pTab_00,iVar3,reg,iColPos);
                }
                v._4_4_ = v._4_4_ + 1;
              }
LAB_00225c48:
            }
            if (v._4_4_ == 0) {
              pParse->nMem = pParse->nMem + 1;
              sqlite3VdbeAddOp2(p,0x4b,0,iVar1 + 2);
              v._4_4_ = 1;
            }
            sqlite3VdbeAddOp3(p,0x61,iVar1 + 2,v._4_4_,p3);
            if (_iCur == (Index *)0x0) {
              sqlite3VdbeAddOp3(p,0x80,iVar3,p3,p2);
            }
            else {
              sqlite3VdbeAddOp4Int(p,0x8a,iVar3,p3,iVar1 + 2,(uint)_iCur->nKeyCol);
            }
            sqlite3VdbeChangeP5(p,2);
            sqlite3VdbeAddOp2(p,0x27,iVar3,addr_00 + 1);
            sqlite3VdbeJumpHere(p,addr_00);
          }
        }
      }
    }
    else {
      pcVar6 = "UNIQUE";
      if ((pTab_00->aCol[(int)uVar4].colFlags & 1) != 0) {
        pcVar6 = "PRIMARY KEY";
      }
      sqlite3ErrorMsg(pParse,"cannot drop %s column: \"%s\"",pcVar6,_i);
    }
  }
  sqlite3DbFree(db_00,_i);
  sqlite3SrcListDelete(db_00,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterDropColumn(Parse *pParse, SrcList *pSrc, const Token *pName){
  sqlite3 *db = pParse->db;       /* Database handle */
  Table *pTab;                    /* Table to modify */
  int iDb;                        /* Index of db containing pTab in aDb[] */
  const char *zDb;                /* Database containing pTab ("main" etc.) */
  char *zCol = 0;                 /* Name of column to drop */
  int iCol;                       /* Index of column zCol in pTab->aCol[] */

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( NEVER(db->mallocFailed) ) goto exit_drop_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_drop_column;

  /* Make sure this is not an attempt to ALTER a view, virtual table or
  ** system table. */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_drop_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 1) ) goto exit_drop_column;

  /* Find the index of the column being dropped. */
  zCol = sqlite3NameFromToken(db, pName);
  if( zCol==0 ){
    assert( db->mallocFailed );
    goto exit_drop_column;
  }
  iCol = sqlite3ColumnIndex(pTab, zCol);
  if( iCol<0 ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pName);
    goto exit_drop_column;
  }

  /* Do not allow the user to drop a PRIMARY KEY column or a column
  ** constrained by a UNIQUE constraint.  */
  if( pTab->aCol[iCol].colFlags & (COLFLAG_PRIMKEY|COLFLAG_UNIQUE) ){
    sqlite3ErrorMsg(pParse, "cannot drop %s column: \"%s\"",
        (pTab->aCol[iCol].colFlags&COLFLAG_PRIMKEY) ? "PRIMARY KEY" : "UNIQUE",
        zCol
    );
    goto exit_drop_column;
  }

  /* Do not allow the number of columns to go to zero */
  if( pTab->nCol<=1 ){
    sqlite3ErrorMsg(pParse, "cannot drop column \"%s\": no other columns exist",zCol);
    goto exit_drop_column;
  }

  /* Edit the sqlite_schema table */
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  zDb = db->aDb[iDb].zDbSName;
#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, zCol) ){
    goto exit_drop_column;
  }
#endif
  renameTestSchema(pParse, zDb, iDb==1, "", 0);
  renameFixQuotes(pParse, zDb, iDb==1);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_drop_column(%d, sql, %d) "
      "WHERE (type=='table' AND tbl_name=%Q COLLATE nocase)"
      , zDb, iDb, iCol, pTab->zName
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iDb, INITFLAG_AlterDrop);
  renameTestSchema(pParse, zDb, iDb==1, "after drop column", 1);

  /* Edit rows of table on disk */
  if( pParse->nErr==0 && (pTab->aCol[iCol].colFlags & COLFLAG_VIRTUAL)==0 ){
    int i;
    int addr;
    int reg;
    int regRec;
    Index *pPk = 0;
    int nField = 0;               /* Number of non-virtual columns after drop */
    int iCur;
    Vdbe *v = sqlite3GetVdbe(pParse);
    iCur = pParse->nTab++;
    sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite);
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    reg = ++pParse->nMem;
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, reg);
      pParse->nMem += pTab->nCol;
    }else{
      pPk = sqlite3PrimaryKeyIndex(pTab);
      pParse->nMem += pPk->nColumn;
      for(i=0; i<pPk->nKeyCol; i++){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, reg+i+1);
      }
      nField = pPk->nKeyCol;
    }
    regRec = ++pParse->nMem;
    for(i=0; i<pTab->nCol; i++){
      if( i!=iCol && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        int regOut;
        if( pPk ){
          int iPos = sqlite3TableColumnToIndex(pPk, i);
          int iColPos = sqlite3TableColumnToIndex(pPk, iCol);
          if( iPos<pPk->nKeyCol ) continue;
          regOut = reg+1+iPos-(iPos>iColPos);
        }else{
          regOut = reg+1+nField;
        }
        if( i==pTab->iPKey ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, regOut);
        }else{
          sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOut);
        }
        nField++;
      }
    }
    if( nField==0 ){
      /* dbsqlfuzz 5f09e7bcc78b4954d06bf9f2400d7715f48d1fef */
      pParse->nMem++;
      sqlite3VdbeAddOp2(v, OP_Null, 0, reg+1);
      nField = 1;
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg+1, nField, regRec);
    if( pPk ){
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iCur, regRec, reg+1, pPk->nKeyCol);
    }else{
      sqlite3VdbeAddOp3(v, OP_Insert, iCur, regRec, reg);
    }
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);

    sqlite3VdbeAddOp2(v, OP_Next, iCur, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
  }

exit_drop_column:
  sqlite3DbFree(db, zCol);
  sqlite3SrcListDelete(db, pSrc);
}